

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_skydome.cpp
# Opt level: O1

void __thiscall FSkyVertexBuffer::BindVBO(FSkyVertexBuffer *this)

{
  GLenum GVar1;
  GLenum GVar2;
  _func_void_GLenum **pp_Var3;
  GLenum GVar4;
  _func_void_GLenum **pp_Var5;
  
  (*_ptrc_glBindBuffer)(0x8892,(this->super_FVertexBuffer).vbo_id);
  if (gl.legacyMode == false) {
    GVar1 = 3;
    (*_ptrc_glVertexAttribPointer)(0,3,0x1406,'\0',0x18,(void *)0x0);
    GVar4 = 1;
    GVar2 = 2;
    (*_ptrc_glVertexAttribPointer)(1,2,0x1406,'\0',0x18,(void *)0xc);
    (*_ptrc_glVertexAttribPointer)(2,4,0x1401,'\x01',0x18,(void *)0x14);
    (*_ptrc_glEnableVertexAttribArray)(0);
    pp_Var3 = (_func_void_GLenum **)&_ptrc_glDisableVertexAttribArray;
    pp_Var5 = (_func_void_GLenum **)&_ptrc_glEnableVertexAttribArray;
  }
  else {
    (*_ptrc_glVertexPointer)(3,0x1406,0x18,(void *)0x0);
    (*_ptrc_glTexCoordPointer)(2,0x1406,0x18,(void *)0xc);
    (*_ptrc_glColorPointer)(4,0x1401,0x18,(void *)0x14);
    GVar1 = 0x8076;
    pp_Var3 = &_ptrc_glDisableClientState;
    GVar2 = 0x8078;
    GVar4 = 0x8074;
    pp_Var5 = &_ptrc_glEnableClientState;
  }
  (**pp_Var5)(GVar4);
  (**pp_Var5)(GVar2);
  (**pp_Var3)(GVar1);
  return;
}

Assistant:

void FSkyVertexBuffer::BindVBO()
{
	glBindBuffer(GL_ARRAY_BUFFER, vbo_id);
	if (!gl.legacyMode)
	{
		glVertexAttribPointer(VATTR_VERTEX, 3, GL_FLOAT, false, sizeof(FSkyVertex), &VSO->x);
		glVertexAttribPointer(VATTR_TEXCOORD, 2, GL_FLOAT, false, sizeof(FSkyVertex), &VSO->u);
		glVertexAttribPointer(VATTR_COLOR, 4, GL_UNSIGNED_BYTE, true, sizeof(FSkyVertex), &VSO->color);
		glEnableVertexAttribArray(VATTR_VERTEX);
		glEnableVertexAttribArray(VATTR_TEXCOORD);
		glEnableVertexAttribArray(VATTR_COLOR);
		glDisableVertexAttribArray(VATTR_VERTEX2);
	}
	else
	{
		glVertexPointer(3, GL_FLOAT, sizeof(FSkyVertex), &VSO->x);
		glTexCoordPointer(2, GL_FLOAT, sizeof(FSkyVertex), &VSO->u);
		glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(FSkyVertex), &VSO->color);
		glEnableClientState(GL_VERTEX_ARRAY);
		glEnableClientState(GL_TEXTURE_COORD_ARRAY);
		glDisableClientState(GL_COLOR_ARRAY);
	}
}